

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void custom_compare_primitive_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffffbd8;
  fdb_file_handle *in_stack_fffffffffffffbe0;
  fdb_iterator *in_stack_fffffffffffffbe8;
  size_t in_stack_fffffffffffffc00;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  double key_double_prev;
  double key_double;
  char bodybuf [256];
  char keybuf [256];
  fdb_iterator *iterator;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffbe0,(fdb_kvs_handle **)in_stack_fffffffffffffbd8,
             (fdb_kvs_config *)0x11221f);
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)doc,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x973);
    custom_compare_primitive_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x973,"void custom_compare_primitive_test()");
    }
  }
  for (n = 0; n < 10; n = n + 1) {
    key_double_prev = 10000.0 / ((double)n * 11.0);
    bodybuf._248_8_ = key_double_prev;
    sprintf((char *)&key_double,"value: %d, %f",SUB84(key_double_prev,0),(ulong)(uint)n);
    meta = (void *)0x112343;
    sVar2 = strlen((char *)&key_double);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                   (size_t)in_stack_fffffffffffffbd8,meta,sVar2 + 1,(void *)0x112376,
                   in_stack_fffffffffffffc00);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffbd8 + (long)n * 8));
  }
  fdb_iterator_init((fdb_kvs_handle *)doc,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,(void *)0x0
                    ,0,0);
  fconfig.num_blocks_readahead = 0;
  fconfig.bottom_up_index_build = false;
  fconfig._245_3_ = 0xbff000;
  do {
    fVar1 = fdb_iterator_get((fdb_iterator *)kvs_config.custom_cmp,(fdb_doc **)_cmp_double);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x983);
      custom_compare_primitive_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x983,"void custom_compare_primitive_test()");
      }
    }
    memcpy(&key_double_prev,pvRam0000000000000020,sRam0000000000000000);
    if (key_double_prev <= (double)fconfig._240_8_) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x985);
      custom_compare_primitive_test::__test_pass = 0;
      if (key_double_prev <= (double)fconfig._240_8_) {
        __assert_fail("key_double > key_double_prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x985,"void custom_compare_primitive_test()");
      }
    }
    fconfig._240_8_ = key_double_prev;
    fdb_doc_free((fdb_doc *)0x1124fe);
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffbd8);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffbe8);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbd8,'\0');
  fdb_iterator_init((fdb_kvs_handle *)doc,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,(void *)0x0
                    ,0,0);
  fconfig.num_blocks_readahead = 0;
  fconfig.bottom_up_index_build = false;
  fconfig._245_3_ = 0xbff000;
  do {
    fVar1 = fdb_iterator_get((fdb_iterator *)kvs_config.custom_cmp,(fdb_doc **)_cmp_double);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x993);
      custom_compare_primitive_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x993,"void custom_compare_primitive_test()");
      }
    }
    memcpy(&key_double_prev,pvRam0000000000000020,sRam0000000000000000);
    if (key_double_prev <= (double)fconfig._240_8_) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x995);
      custom_compare_primitive_test::__test_pass = 0;
      if (key_double_prev <= (double)fconfig._240_8_) {
        __assert_fail("key_double > key_double_prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x995,"void custom_compare_primitive_test()");
      }
    }
    fconfig._240_8_ = key_double_prev;
    fdb_doc_free((fdb_doc *)0x112696);
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffbd8);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffbe8);
  fdb_compact(in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
  fdb_iterator_init((fdb_kvs_handle *)doc,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,(void *)0x0
                    ,0,0);
  fconfig.num_blocks_readahead = 0;
  fconfig.bottom_up_index_build = false;
  fconfig._245_3_ = 0xbff000;
  do {
    fVar1 = fdb_iterator_get((fdb_iterator *)kvs_config.custom_cmp,(fdb_doc **)_cmp_double);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x9a4);
      custom_compare_primitive_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x9a4,"void custom_compare_primitive_test()");
      }
    }
    memcpy(&key_double_prev,pvRam0000000000000020,sRam0000000000000000);
    if (key_double_prev <= (double)fconfig._240_8_) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x9a6);
      custom_compare_primitive_test::__test_pass = 0;
      if (key_double_prev <= (double)fconfig._240_8_) {
        __assert_fail("key_double > key_double_prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x9a6,"void custom_compare_primitive_test()");
      }
    }
    fconfig._240_8_ = key_double_prev;
    fdb_doc_free((fdb_doc *)0x112830);
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffbd8);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffbe8);
  fdb_kvs_close(in_stack_fffffffffffffbd8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffbd8);
  for (n = 0; n < 10; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x11288b);
  }
  fdb_shutdown();
  memleak_end();
  if (custom_compare_primitive_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","custom compare function for primitive key test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","custom compare function for primitive key test");
  }
  return;
}

Assistant:

void custom_compare_primitive_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    double key_double, key_double_prev;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    kvs_config.custom_cmp = _cmp_double;

    // open db with custom compare function for double key type
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_primitive_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        key_double = 10000/(i*11.0);
        memcpy(keybuf, &key_double, sizeof(key_double));
        sprintf(bodybuf, "value: %d, %f", i, key_double);
        fdb_doc_create(&doc[i], (void*)keybuf, sizeof(key_double), NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for primitive key test");
}